

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearResampler.cpp
# Opt level: O0

void __thiscall
SRCTools::LinearResampler::process
          (LinearResampler *this,FloatSample **inSamples,uint *inLength,FloatSample **outSamples,
          uint *outLength)

{
  float fVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  FloatSample *pFVar5;
  uint local_38;
  uint local_34;
  uint chIx_1;
  uint chIx;
  uint *outLength_local;
  FloatSample **outSamples_local;
  uint *inLength_local;
  FloatSample **inSamples_local;
  LinearResampler *this_local;
  
  if (*inLength != 0) {
    while (*outLength != 0) {
      while (1.0 <= this->position) {
        this->position = this->position + -1.0;
        *inLength = *inLength - 1;
        for (local_34 = 0; local_34 < 2; local_34 = local_34 + 1) {
          pFVar5 = *inSamples;
          *inSamples = pFVar5 + 1;
          this->lastInputSamples[local_34] = *pFVar5;
        }
        if (*inLength == 0) {
          return;
        }
      }
      for (local_38 = 0; local_38 < 2; local_38 = local_38 + 1) {
        fVar1 = this->lastInputSamples[local_38];
        dVar4 = this->position;
        fVar2 = (*inSamples)[local_38];
        fVar3 = this->lastInputSamples[local_38];
        pFVar5 = *outSamples;
        *outSamples = pFVar5 + 1;
        *pFVar5 = (float)(dVar4 * (double)(fVar2 - fVar3) + (double)fVar1);
      }
      *outLength = *outLength - 1;
      this->position = this->inputToOutputRatio + this->position;
    }
  }
  return;
}

Assistant:

void LinearResampler::process(const FloatSample *&inSamples, unsigned int &inLength, FloatSample *&outSamples, unsigned int &outLength) {
	if (inLength == 0) return;
	while (outLength > 0) {
		while (1.0 <= position) {
			position--;
			inLength--;
			for (unsigned int chIx = 0; chIx < LINEAR_RESAMPER_CHANNEL_COUNT; ++chIx) {
				lastInputSamples[chIx] = *(inSamples++);
			}
			if (inLength == 0) return;
		}
		for (unsigned int chIx = 0; chIx < LINEAR_RESAMPER_CHANNEL_COUNT; chIx++) {
			*(outSamples++) = FloatSample(lastInputSamples[chIx] + position * (inSamples[chIx] - lastInputSamples[chIx]));
		}
		outLength--;
		position += inputToOutputRatio;
	}
}